

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManPlacementRefine(Emb_Man_t *p,int nIters,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  unsigned_short *puVar4;
  uint uVar5;
  abctime aVar6;
  void *__ptr;
  void *__ptr_00;
  float *pArray;
  float *pArray_00;
  int *__ptr_01;
  int *__ptr_02;
  ulong uVar7;
  abctime aVar8;
  uint uVar9;
  unsigned_short uVar10;
  uint uVar11;
  size_t __size;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  
  aVar6 = Abc_Clock();
  if (p->pPlacement != (unsigned_short *)0x0) {
    __size = (long)p->nObjs << 2;
    __ptr = malloc(__size);
    __ptr_00 = malloc(__size);
    pArray = (float *)malloc(__size);
    pArray_00 = (float *)malloc(__size);
    if (nIters < 1) {
      nIters = 0;
    }
    uVar11 = 0;
    while (uVar11 != nIters) {
      iVar14 = p->nObjData;
      uVar9 = 0;
      dVar22 = 0.0;
      while (((int)uVar9 < iVar14 && (p->pObjData != (int *)0x0))) {
        puVar1 = (uint *)(p->pObjData + uVar9);
        puVar4 = p->pPlacement;
        uVar2 = puVar1[1];
        uVar3 = puVar1[4];
        uVar15 = (uint)puVar4[uVar3 * 2];
        uVar13 = 0;
        if (0 < (int)uVar2) {
          uVar13 = uVar2;
        }
        uVar18 = (uint)puVar4[(ulong)(uVar3 * 2) + 1];
        uVar16 = (uint)puVar4[uVar3 * 2];
        uVar19 = (uint)puVar4[(ulong)(uVar3 * 2) + 1];
        for (lVar12 = 0; uVar13 != (uint)lVar12; lVar12 = lVar12 + 1) {
          uVar5 = (uint)puVar4[puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar12 + 5] + 4] * 2
                              ];
          if (puVar4[puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar12 + 5] + 4] * 2] <=
              uVar15) {
            uVar15 = uVar5;
          }
          if (uVar16 <= uVar5) {
            uVar16 = uVar5;
          }
          uVar5 = (uint)puVar4[(ulong)(puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar12 + 5]
                                              + 4] * 2) + 1];
          if (puVar4[(ulong)(puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar12 + 5] + 4] * 2)
                     + 1] <= uVar18) {
            uVar18 = uVar5;
          }
          if (uVar19 <= uVar5) {
            uVar19 = uVar5;
          }
        }
        *(float *)((long)__ptr + (ulong)uVar3 * 4) = (float)(uVar16 + uVar15) * 0.5;
        *(float *)((long)__ptr_00 + (ulong)uVar3 * 4) = (float)(uVar19 + uVar18) * 0.5;
        dVar22 = dVar22 + (double)(int)((uVar16 - (uVar15 + uVar18)) + uVar19);
        uVar9 = uVar9 + uVar2 + (*puVar1 >> 4) + 5;
      }
      uVar9 = 0;
      while (((int)uVar9 < iVar14 && (p->pObjData != (int *)0x0))) {
        puVar1 = (uint *)(p->pObjData + uVar9);
        uVar7 = (ulong)puVar1[4];
        fVar21 = *(float *)((long)__ptr + uVar7 * 4);
        fVar20 = *(float *)((long)__ptr_00 + uVar7 * 4);
        for (uVar17 = 0; *puVar1 >> 4 != uVar17; uVar17 = uVar17 + 1) {
          fVar21 = fVar21 + *(float *)((long)__ptr +
                                      (ulong)puVar1[4 - (long)(int)puVar1[uVar17 + 5]] * 4);
          fVar20 = fVar20 + *(float *)((long)__ptr_00 +
                                      (ulong)puVar1[4 - (long)(int)puVar1[uVar17 + 5]] * 4);
        }
        pArray[uVar7] = fVar21 / (float)((*puVar1 >> 4) + 1);
        pArray_00[puVar1[4]] = fVar20 / (float)((*puVar1 >> 4) + 1);
        uVar9 = uVar9 + (*puVar1 >> 4) + puVar1[1] + 5;
      }
      __ptr_01 = Gia_SortFloats(pArray,(int *)0x0,p->nObjs);
      __ptr_02 = Gia_SortFloats(pArray_00,(int *)0x0,p->nObjs);
      uVar9 = p->nObjs;
      uVar7 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar7 = 0;
      }
      for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
        puVar4 = p->pPlacement;
        uVar10 = (unsigned_short)(int)(((double)(int)uVar17 * 32767.0) / (double)(int)uVar9);
        puVar4[(long)__ptr_01[uVar17] * 2] = uVar10;
        puVar4[(long)__ptr_02[uVar17] * 2 + 1] = uVar10;
      }
      free(__ptr_01);
      free(__ptr_02);
      uVar11 = uVar11 + 1;
      if (fVerbose != 0) {
        iVar14 = 0x7b0cf0;
        printf("%2d : HPWL = %e  ",dVar22,(ulong)uVar11);
        Abc_Print(iVar14,"%s =","Time");
        aVar8 = Abc_Clock();
        Abc_Print(iVar14,"%9.2f sec\n",(double)(aVar8 - aVar6) / 1000000.0);
      }
    }
    free(__ptr);
    free(__ptr_00);
    free(pArray);
    free(pArray_00);
    return;
  }
  return;
}

Assistant:

void Emb_ManPlacementRefine( Emb_Man_t * p, int nIters, int fVerbose )
{
    Emb_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pEdgeX, * pEdgeY;
    float * pVertX, * pVertY;
    float VertX, VertY;
    int * pPermX, * pPermY;
    int i, k, Iter, iMinX, iMaxX, iMinY, iMaxY;
    abctime clk = Abc_Clock();
    if ( p->pPlacement == NULL )
        return;
    pEdgeX = ABC_ALLOC( float, p->nObjs );
    pEdgeY = ABC_ALLOC( float, p->nObjs );
    pVertX = ABC_ALLOC( float, p->nObjs );
    pVertY = ABC_ALLOC( float, p->nObjs );
    // refine placement
    CostPrev = 0.0;
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Emb_ManForEachObj( p, pThis, i )
        {
            iMinX = iMaxX = p->pPlacement[2*pThis->Value+0];
            iMinY = iMaxY = p->pPlacement[2*pThis->Value+1];
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, p->pPlacement[2*pNext->Value+0] );
                iMaxX = Abc_MaxInt( iMaxX, p->pPlacement[2*pNext->Value+0] );
                iMinY = Abc_MinInt( iMinY, p->pPlacement[2*pNext->Value+1] );
                iMaxY = Abc_MaxInt( iMaxY, p->pPlacement[2*pNext->Value+1] );
            }
            pEdgeX[pThis->Value] = 0.5 * (iMaxX + iMinX);
            pEdgeY[pThis->Value] = 0.5 * (iMaxY + iMinY);
            CostThis += (iMaxX - iMinX) + (iMaxY - iMinY);
        }
        // compute new centers of objects
        Emb_ManForEachObj( p, pThis, i )
        {
            VertX = pEdgeX[pThis->Value];
            VertY = pEdgeY[pThis->Value];
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                VertX += pEdgeX[pNext->Value];
                VertY += pEdgeY[pNext->Value];
            }
            pVertX[pThis->Value] = VertX / (Emb_ObjFaninNum(pThis) + 1);
            pVertY[pThis->Value] = VertY / (Emb_ObjFaninNum(pThis) + 1);
        }
        // sort these numbers
        pPermX = Gia_SortFloats( pVertX, NULL, p->nObjs );
        pPermY = Gia_SortFloats( pVertY, NULL, p->nObjs );
        for ( k = 0; k < p->nObjs; k++ )
        {
            p->pPlacement[2*pPermX[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
            p->pPlacement[2*pPermY[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        }
        ABC_FREE( pPermX );
        ABC_FREE( pPermY );
        // evaluate cost
        if ( fVerbose )
        {
        printf( "%2d : HPWL = %e  ", Iter+1, CostThis );
        ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    ABC_FREE( pEdgeX );
    ABC_FREE( pEdgeY );
    ABC_FREE( pVertX );
    ABC_FREE( pVertY );
}